

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::option::cla_name_help
          (option *this,ostream *ostr,cstring *cla_tag,cstring *negation_prefix_)

{
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  basic_cstring<const_char> *in_RCX;
  ostream *in_RSI;
  
  bVar1 = unit_test::basic_cstring<const_char>::is_empty(in_RCX);
  if (bVar1) {
    unit_test::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)this,
               (basic_cstring<const_char> *)ostr);
  }
  else {
    std::operator<<(in_RSI,'[');
    pbVar2 = unit_test::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)this,
                        (basic_cstring<const_char> *)ostr);
    std::operator<<(pbVar2,']');
    unit_test::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)this,
               (basic_cstring<const_char> *)ostr);
  }
  return;
}

Assistant:

virtual void    cla_name_help( std::ostream& ostr, cstring cla_tag, cstring negation_prefix_ ) const
    {
        if( negation_prefix_.is_empty() )
            ostr << cla_tag;
        else
            ostr << '[' << negation_prefix_ << ']' << cla_tag;
    }